

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O3

void Mio_WriteLibrary(FILE *pFile,Mio_Library_t *pLib,int fPrintSops,int fShort,int fSelected)

{
  long lVar1;
  Mio_Gate_t *pMVar2;
  char *pcVar3;
  bool bVar4;
  int fAllPins;
  int *piVar5;
  void *pvVar6;
  Mio_Library_t *pLib_00;
  Mio_Cell2_t *__ptr;
  void *pvVar7;
  ulong uVar8;
  Mio_Pin_t *pPin;
  char *pcVar9;
  void **ppvVar10;
  ulong uVar11;
  int iVar12;
  size_t sVar13;
  int iVar14;
  uint NameLen;
  ulong uVar15;
  int nCells;
  int local_78;
  ulong local_70;
  int local_4c;
  int *local_48;
  Mio_Library_t *local_40;
  ulong local_38;
  
  piVar5 = (int *)malloc(0x10);
  piVar5[0] = 1000;
  piVar5[1] = 0;
  pvVar6 = malloc(8000);
  *(void **)(piVar5 + 2) = pvVar6;
  fAllPins = 1;
  if (fShort == 0) {
    fAllPins = Mio_CheckGates(pLib);
  }
  local_48 = piVar5;
  local_40 = pLib;
  if (fSelected == 0) {
    if (0 < pLib->nGates) {
      iVar12 = 1000;
      sVar13 = 0;
      iVar14 = 0;
      local_70 = 0;
      do {
        pMVar2 = pLib->ppGates0[local_70];
        if ((int)local_70 == iVar12) {
          pvVar6 = *(void **)(piVar5 + 2);
          if (local_70 < 0x10) {
            if (pvVar6 == (void *)0x0) {
              pvVar6 = malloc(0x80);
            }
            else {
              pvVar6 = realloc(pvVar6,0x80);
            }
            *(void **)(piVar5 + 2) = pvVar6;
            iVar12 = 0x10;
          }
          else {
            if (pvVar6 == (void *)0x0) {
              pvVar6 = malloc(sVar13);
            }
            else {
              pvVar6 = realloc(pvVar6,sVar13);
            }
            *(void **)(piVar5 + 2) = pvVar6;
            iVar12 = iVar14;
          }
        }
        else {
          pvVar6 = *(void **)(piVar5 + 2);
        }
        *(Mio_Gate_t **)((long)pvVar6 + local_70 * 8) = pMVar2;
        local_70 = local_70 + 1;
        iVar14 = iVar14 + 2;
        sVar13 = sVar13 + 0x10;
      } while ((long)local_70 < (long)pLib->nGates);
      piVar5[1] = (int)local_70;
      *piVar5 = iVar12;
      goto LAB_003de12d;
    }
    local_70 = 0;
LAB_003de211:
    bVar4 = false;
    local_78 = 0;
    NameLen = 0;
    iVar12 = 0;
  }
  else {
    pLib_00 = (Mio_Library_t *)Abc_FrameReadLibGen();
    __ptr = Mio_CollectRootsNew2(pLib_00,6,&local_4c,0);
    if (local_4c < 1) {
      local_70 = 0;
      if (__ptr == (Mio_Cell2_t *)0x0) goto LAB_003de211;
    }
    else {
      ppvVar10 = &__ptr->pMioGate;
      iVar12 = 1000;
      sVar13 = 0;
      iVar14 = 0;
      local_70 = 0;
      do {
        pvVar6 = *ppvVar10;
        if ((int)local_70 == iVar12) {
          pvVar7 = *(void **)(piVar5 + 2);
          if (local_70 < 0x10) {
            if (pvVar7 == (void *)0x0) {
              pvVar7 = malloc(0x80);
            }
            else {
              pvVar7 = realloc(pvVar7,0x80);
            }
            *(void **)(piVar5 + 2) = pvVar7;
            iVar12 = 0x10;
          }
          else {
            if (pvVar7 == (void *)0x0) {
              pvVar7 = malloc(sVar13);
            }
            else {
              pvVar7 = realloc(pvVar7,sVar13);
            }
            *(void **)(piVar5 + 2) = pvVar7;
            iVar12 = iVar14;
          }
        }
        else {
          pvVar7 = *(void **)(piVar5 + 2);
        }
        *(void **)((long)pvVar7 + local_70 * 8) = pvVar6;
        local_70 = local_70 + 1;
        ppvVar10 = ppvVar10 + 10;
        iVar14 = iVar14 + 2;
        sVar13 = sVar13 + 0x10;
      } while ((long)local_70 < (long)local_4c);
      piVar5[1] = (int)local_70;
      *piVar5 = iVar12;
    }
    free(__ptr);
LAB_003de12d:
    bVar4 = 0 < (int)local_70;
    if ((int)local_70 < 1) goto LAB_003de211;
    lVar1 = *(long *)(piVar5 + 2);
    local_38 = local_70 & 0xffffffff;
    uVar11 = 0;
    iVar12 = 0;
    NameLen = 0;
    uVar8 = 0;
    do {
      pMVar2 = *(Mio_Gate_t **)(lVar1 + uVar11 * 8);
      sVar13 = strlen(pMVar2->pName);
      if ((int)sVar13 < (int)uVar8) {
        sVar13 = uVar8;
      }
      uVar8 = sVar13 & 0xffffffff;
      local_78 = (int)sVar13;
      sVar13 = strlen(pMVar2->pOutName);
      uVar15 = sVar13 & 0xffffffff;
      if ((int)sVar13 < (int)NameLen) {
        uVar15 = (ulong)NameLen;
      }
      sVar13 = strlen(pMVar2->pForm);
      iVar14 = (int)sVar13;
      if ((int)sVar13 < iVar12) {
        iVar14 = iVar12;
      }
      iVar12 = iVar14;
      pPin = Mio_GateReadPins(pMVar2);
      if (pPin == (Mio_Pin_t *)0x0) {
        NameLen = (uint)uVar15;
      }
      else {
        do {
          sVar13 = strlen(pPin->pName);
          NameLen = (uint)sVar13;
          if ((int)(uint)sVar13 < (int)(uint)uVar15) {
            NameLen = (uint)uVar15;
          }
          pPin = Mio_PinReadNext(pPin);
          uVar15 = (ulong)NameLen;
        } while (pPin != (Mio_Pin_t *)0x0);
      }
      uVar11 = uVar11 + 1;
      piVar5 = local_48;
    } while (uVar11 != local_38);
  }
  pcVar3 = local_40->pName;
  pcVar9 = Extra_TimeStamp();
  fprintf((FILE *)pFile,"# The genlib library \"%s\" with %d gates written by ABC on %s\n",pcVar3,
          local_70 & 0xffffffff,pcVar9);
  pvVar6 = *(void **)(piVar5 + 2);
  if (bVar4) {
    uVar8 = 0;
    do {
      Mio_WriteGate(pFile,*(Mio_Gate_t **)((long)pvVar6 + uVar8 * 8),local_78,NameLen,iVar12,
                    fPrintSops,fAllPins);
      uVar8 = uVar8 + 1;
    } while ((local_70 & 0xffffffff) != uVar8);
  }
  else if (pvVar6 == (void *)0x0) goto LAB_003de2a2;
  free(pvVar6);
LAB_003de2a2:
  free(local_48);
  return;
}

Assistant:

void Mio_WriteLibrary( FILE * pFile, Mio_Library_t * pLib, int fPrintSops, int fShort, int fSelected )
{
    Mio_Gate_t * pGate;
    Mio_Pin_t * pPin;
    Vec_Ptr_t * vGates = Vec_PtrAlloc( 1000 );
    int i, nCells, GateLen = 0, NameLen = 0, FormLen = 0;
    int fAllPins = fShort || Mio_CheckGates( pLib );
    if ( fSelected )
    {
        Mio_Cell2_t * pCells = Mio_CollectRootsNewDefault2( 6, &nCells, 0 );
        for ( i = 0; i < nCells; i++ )
            Vec_PtrPush( vGates, pCells[i].pMioGate );
        ABC_FREE( pCells );
    }
    else
    {
        for ( i = 0; i < pLib->nGates; i++ )
            Vec_PtrPush( vGates, pLib->ppGates0[i] );
    }
    Vec_PtrForEachEntry( Mio_Gate_t *, vGates, pGate, i )
    {
        GateLen = Abc_MaxInt( GateLen, strlen(pGate->pName) );
        NameLen = Abc_MaxInt( NameLen, strlen(pGate->pOutName) );
        FormLen = Abc_MaxInt( FormLen, strlen(pGate->pForm) );
        Mio_GateForEachPin( pGate, pPin )
            NameLen = Abc_MaxInt( NameLen, strlen(pPin->pName) );
    }
    fprintf( pFile, "# The genlib library \"%s\" with %d gates written by ABC on %s\n", pLib->pName, Vec_PtrSize(vGates), Extra_TimeStamp() );
    Vec_PtrForEachEntry( Mio_Gate_t *, vGates, pGate, i )
        Mio_WriteGate( pFile, pGate, GateLen, NameLen, FormLen, fPrintSops, fAllPins );
    Vec_PtrFree( vGates );
}